

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

uint8_t __thiscall
anon_unknown.dwarf_4cc93::CtorEvalExternalInterface::load8u
          (CtorEvalExternalInterface *this,Address addr,Name memoryName)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  key_type local_30;
  
  local_30.super_IString.str._M_str = memoryName.super_IString.str._M_str;
  local_30.super_IString.str._M_len = memoryName.super_IString.str._M_len;
  p_Var2 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->memories)._M_h,
                      (ulong)local_30.super_IString.str._M_str %
                      (this->memories)._M_h._M_bucket_count,&local_30,
                      (__hash_code)local_30.super_IString.str._M_str);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var2 = p_Var1->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    if ((ulong)((long)p_Var2[4]._M_nxt - (long)p_Var2[3]._M_nxt) < addr.addr + 1) {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)(p_Var2 + 3),addr.addr + 1);
    }
    return (((vector<char,_std::allocator<char>_> *)(p_Var2 + 3))->
           super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
           [addr.addr];
  }
  __assert_fail("it != memories.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                ,0x1b8,
                "T *(anonymous namespace)::CtorEvalExternalInterface::getMemory(Address, Name) [T = unsigned char]"
               );
}

Assistant:

uint8_t load8u(Address addr, Name memoryName) override {
    return doLoad<uint8_t>(addr, memoryName);
  }